

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O1

int Dsd_TreeCollectDecomposableVars_rec(DdManager *dd,Dsd_Node_t *pNode,int *pVars,int *nVars)

{
  Dsd_Type_t DVar1;
  DdNode *pDVar2;
  bool bVar3;
  int iVar4;
  ushort uVar5;
  int *piVar6;
  long lVar7;
  
  if (dd == (DdManager *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                  ,500,
                  "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)"
                 );
  }
  if (((ulong)dd & 1) == 0) {
    iVar4 = 0;
    if (1 < *(short *)((long)&(dd->sentinel).Id + 4)) {
      uVar5 = *(ushort *)((long)&(dd->sentinel).Id + 4);
      piVar6 = (int *)(ulong)uVar5;
      if ((short)uVar5 < 1) {
        bVar3 = true;
      }
      else {
        lVar7 = 0;
        bVar3 = false;
        do {
          iVar4 = Dsd_TreeCollectDecomposableVars_rec
                            ((DdManager *)
                             (*(ulong *)(&((dd->sentinel).type.kids.E)->index + lVar7 * 2) &
                             0xfffffffffffffffe),pNode,pVars,piVar6);
          if (iVar4 != 0) {
            bVar3 = true;
          }
          lVar7 = lVar7 + 1;
          uVar5 = *(ushort *)((long)&(dd->sentinel).Id + 4);
          piVar6 = (int *)(long)(short)uVar5;
        } while (lVar7 < (long)piVar6);
        bVar3 = !bVar3;
      }
      iVar4 = 1;
      if ((bVar3) &&
         ((((short)uVar5 < 5 || ((dd->sentinel).index - 3 < 2)) && (iVar4 = 0, 0 < (short)uVar5))))
      {
        pDVar2 = (dd->sentinel).type.kids.E;
        lVar7 = 0;
        do {
          piVar6 = (int *)(*(ulong *)(&pDVar2->index + lVar7 * 2) & 0xfffffffffffffffe);
          if (*piVar6 == 2) {
            if (pNode == (Dsd_Node_t *)0x0) {
              *pVars = *pVars + 1;
            }
            else {
              DVar1 = **(Dsd_Type_t **)(piVar6 + 4);
              iVar4 = *pVars;
              *pVars = iVar4 + 1;
              (&pNode->Type)[iVar4] = DVar1;
            }
          }
          lVar7 = lVar7 + 1;
        } while ((short)uVar5 != lVar7);
        iVar4 = 0;
      }
    }
    return iVar4;
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                ,0x1f5,
                "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)");
}

Assistant:

int Dsd_TreeCollectDecomposableVars_rec( DdManager * dd, Dsd_Node_t * pNode, int * pVars, int * nVars )
{
    int fSkipThisNode, i;
    Dsd_Node_t * pTemp;
    int fVerbose = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );

    if ( pNode->nDecs <= 1 )
        return 0;

    // go through the list of successors and call recursively 
    fSkipThisNode = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
        if ( Dsd_TreeCollectDecomposableVars_rec(dd, Dsd_Regular(pNode->pDecs[i]), pVars, nVars) )
            fSkipThisNode = 1;

    if ( !fSkipThisNode && (pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR || pNode->nDecs <= 4) )
    {
if ( fVerbose )
printf( "Node of type <%d> (OR=6,EXOR=8,RAND=1): ", pNode->Type );

        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pTemp = Dsd_Regular(pNode->pDecs[i]);
            if ( pTemp->Type == DSD_NODE_BUF )
            {
                if ( pVars )
                    pVars[ (*nVars)++ ] = pTemp->S->index;
                else
                    (*nVars)++;
                    
if ( fVerbose )
printf( "%d ", pTemp->S->index );
            }
        }
if ( fVerbose )
printf( "\n" );
    }
    else
        fSkipThisNode = 1;


    return fSkipThisNode;
}